

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

void __thiscall gl4cts::KHRDebug::GroupsTest::verifyEmptyLog(GroupsTest *this)

{
  GLuint GVar1;
  GLenum err;
  TestError *this_00;
  GLsizei local_4c;
  GLuint ret;
  GLsizei length;
  GLenum severity;
  GLuint id;
  GLenum type;
  GLenum source;
  GLchar messageLog [32];
  GroupsTest *this_local;
  
  GVar1 = (*((this->super_TestBase).m_gl)->getDebugMessageLog)
                    (1,0x20,&id,&severity,(GLuint *)&length,&ret,&local_4c,(GLchar *)&type);
  err = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(err,"GetDebugMessageLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x8b5);
  if (GVar1 != 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"GetDebugMessageLog returned unexpected messages",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x8b9);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void GroupsTest::verifyEmptyLog() const
{
	static const size_t bufSize		  = 32;
	static const size_t read_messages = 1;

	GLchar  messageLog[bufSize];
	GLenum  source;
	GLenum  type;
	GLuint  id;
	GLenum  severity;
	GLsizei length;

	GLuint ret = m_gl->getDebugMessageLog(read_messages /* count */, bufSize /* bufSize */, &source /* sources */,
										  &type /* types */, &id /* ids */, &severity /* severities */,
										  &length /* lengths */, messageLog /* messageLog */);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetDebugMessageLog");

	if (0 != ret)
	{
		TCU_FAIL("GetDebugMessageLog returned unexpected messages");
	}
}